

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

size_t __thiscall tsbp::LeftmostActiveOnly::InitializeSearchTree(LeftmostActiveOnly *this)

{
  Node *pNVar1;
  bool bVar2;
  pointer this_00;
  int *piVar3;
  reference pvVar4;
  unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> local_28;
  unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> layout2D;
  Node *rootNode;
  size_t rootNodeId;
  LeftmostActiveOnly *this_local;
  
  rootNodeId = (size_t)this;
  rootNode = (Node *)boost::
                     add_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                               (&(this->tree).super_type);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->activeNodes,(value_type_conflict1 *)&rootNode);
  layout2D._M_t.super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
  super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
  super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
       (__uniq_ptr_data<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>,_true,_true>)
       boost::
       adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>
       ::operator[](&this->tree,(vertex_descriptor)rootNode);
  *(undefined4 *)
   layout2D._M_t.super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
   super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
   super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl = 0xffffffff;
  *(Status *)
   ((long)layout2D._M_t.
          super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t.
          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
          super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 8) = Root;
  std::make_unique<tsbp::Packing2D>();
  this_00 = std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator->
                      (&local_28);
  Packing2D::Initialize(this_00,&this->items,&this->container);
  std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::operator=
            ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)
             ((long)layout2D._M_t.
                    super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                    .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 0x10),&local_28)
  ;
  bVar2 = std::optional<int>::has_value(&this->fixedItemAtOrigin);
  if (bVar2) {
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    pvVar4 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->itemSpecificPlacementPointsX,(long)*piVar3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar4);
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    pvVar4 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->itemSpecificPlacementPointsY,(long)*piVar3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(pvVar4);
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    pvVar4 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->itemSpecificPlacementPointsX,(long)*piVar3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar4,0,true);
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    pvVar4 = std::
             vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](&this->itemSpecificPlacementPointsY,(long)*piVar3);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(pvVar4,0,true);
  }
  pNVar1 = rootNode;
  std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr(&local_28);
  return (size_t)pNVar1;
}

Assistant:

size_t LeftmostActiveOnly::InitializeSearchTree()
{
    size_t rootNodeId = boost::add_vertex(this->tree);
    this->activeNodes.push_back(rootNodeId);

    Node& rootNode = this->tree[rootNodeId];
    rootNode.ItemIdToPlace = -1;
    rootNode.NodeStatus = BaseNode::Status::Root;

    std::unique_ptr<Packing2D> layout2D = std::make_unique<Packing2D>();
    layout2D->Initialize(items, container);

    rootNode.Packing = std::move(layout2D);

    if (this->fixedItemAtOrigin.has_value())
    {
        // Restrict placement of fixedItem
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].reset();
        this->itemSpecificPlacementPointsY[this->fixedItemAtOrigin.value()].reset();
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].set(0);
        this->itemSpecificPlacementPointsY[this->fixedItemAtOrigin.value()].set(0);

        ////this->tree.m_vertices.reserve(250000000);
    }

    return rootNodeId;
}